

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcUif.c
# Opt level: O3

Vec_Int_t * Wlc_NtkCollectMultipliers(Wlc_Ntk_t *p)

{
  Vec_Int_t *p_00;
  int *__ptr;
  int iVar1;
  long lVar2;
  long lVar3;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  __ptr = (int *)malloc(400);
  p_00->pArray = __ptr;
  iVar1 = p->iObj;
  if (1 < iVar1) {
    lVar3 = 1;
    lVar2 = 0x18;
    do {
      if (p->nObjsAlloc <= lVar3) {
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      if ((*(ushort *)(&p->pObjs->field_0x0 + lVar2) & 0x3f) == 0x2d) {
        Vec_IntPush(p_00,(int)lVar3);
        iVar1 = p->iObj;
      }
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 0x18;
    } while (lVar3 < iVar1);
    if (0 < p_00->nSize) {
      return p_00;
    }
    __ptr = p_00->pArray;
  }
  if (__ptr != (int *)0x0) {
    free(__ptr);
  }
  free(p_00);
  return (Vec_Int_t *)0x0;
}

Assistant:

Vec_Int_t * Wlc_NtkCollectMultipliers( Wlc_Ntk_t * p )
{
    Wlc_Obj_t * pObj;  int i;
    Vec_Int_t * vBoxIds = Vec_IntAlloc( 100 );
    Wlc_NtkForEachObj( p, pObj, i )
        if ( pObj->Type == WLC_OBJ_ARI_MULTI )
            Vec_IntPush( vBoxIds, i );
    if ( Vec_IntSize( vBoxIds ) > 0 )
        return vBoxIds;
    Vec_IntFree( vBoxIds );
    return NULL;
}